

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R.cpp
# Opt level: O1

int main(void)

{
  pointer plVar1;
  bool bVar2;
  int iVar3;
  istream *this;
  longlong lVar4;
  int iVar5;
  size_type __n;
  long lVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int x;
  char elem;
  int M;
  int N;
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  table;
  Network transport;
  allocator_type local_135;
  uint local_134;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  long local_120;
  long local_118;
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  local_110;
  long local_f8;
  long local_f0;
  long local_e8;
  Network local_e0;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x106188) = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_130);
  std::istream::operator>>(this,(int *)&local_134);
  __n = (size_type)local_130;
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)&local_e0,(long)(int)local_134,
             (allocator_type *)&local_124);
  std::
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ::vector(&local_110,__n,(value_type *)&local_e0,&local_135);
  if (local_e0.q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_map != (_Map_pointer)0x0) {
    operator_delete(local_e0.q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_map);
  }
  Network::Network(&local_e0,local_134 * local_130 + 2);
  if (local_130 < 1) {
    local_118 = 0;
    local_120 = 0;
  }
  else {
    lVar9 = 0;
    local_120 = 0;
    local_118 = 0;
    do {
      if (0 < (int)local_134) {
        lVar6 = 0;
        do {
          std::operator>>((istream *)&std::cin,(char *)&local_135);
          if ((byte)local_135 < 0x4e) {
            if (local_135 == (allocator_type)0x2e) {
              lVar4 = -1;
            }
            else if (local_135 == (allocator_type)0x48) {
              lVar4 = 1;
            }
            else {
LAB_0010170a:
              lVar4 = 4;
            }
          }
          else if (local_135 == (allocator_type)0x4e) {
            lVar4 = 3;
          }
          else {
            if (local_135 != (allocator_type)0x4f) goto LAB_0010170a;
            lVar4 = 2;
          }
          local_110.
          super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar9].
          super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar6] = lVar4;
          if (local_135 != (allocator_type)0x2e) {
            iVar3 = (int)lVar9;
            iVar5 = (int)lVar6;
            if ((iVar3 + iVar5 & 1U) == 0) {
              Network::add_edge(&local_e0,local_130 * local_134,local_134 * iVar3 + iVar5,lVar4);
              local_120 = local_120 +
                          local_110.
                          super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar9].
                          super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar6];
            }
            else {
              Network::add_edge(&local_e0,iVar3 * local_134 + iVar5,local_134 * local_130 + 1,lVar4)
              ;
              local_118 = local_118 +
                          local_110.
                          super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar9].
                          super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar6];
            }
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < (int)local_134);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < local_130);
  }
  if (0 < local_130) {
    local_12c = 1;
    local_128 = -1;
    lVar9 = 0;
    do {
      uVar10 = (ulong)local_134;
      if (0 < (int)local_134) {
        local_e8 = lVar9 + 1;
        local_f8 = local_e8 * 3;
        local_f0 = (lVar9 + -1) * 3;
        lVar6 = 1;
        do {
          plVar1 = local_110.
                   super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar9].
                   super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((plVar1[lVar6 + -1] != -1) && (((char)lVar6 + (char)lVar9 + 1U & 1) == 0)) {
            iVar8 = (int)uVar10;
            iVar5 = (int)lVar9 * iVar8;
            iVar3 = (int)lVar6;
            x = iVar3 + iVar5 + -1;
            if ((lVar6 < iVar8) && (plVar1[lVar6] != -1)) {
              Network::add_edge(&local_e0,x,iVar3 + iVar5,1);
            }
            if ((lVar6 != 1) &&
               (local_110.
                super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar9].
                super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6 + -2] != -1)) {
              Network::add_edge(&local_e0,x,iVar3 + iVar5 + -2,1);
            }
            if ((lVar9 != 0) &&
               ((&((local_110.
                    super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                  super__Vector_impl_data._M_start)[local_f0][lVar6 + -1] != -1)) {
              Network::add_edge(&local_e0,x,iVar3 + local_128 * iVar8 + -1,1);
            }
            if ((local_e8 < local_130) &&
               ((&((local_110.
                    super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                  super__Vector_impl_data._M_start)[local_f8][lVar6 + -1] != -1)) {
              Network::add_edge(&local_e0,x,iVar3 + iVar8 * local_12c + -1,1);
            }
          }
          uVar10 = (ulong)(int)local_134;
          bVar2 = lVar6 < (long)uVar10;
          lVar6 = lVar6 + 1;
        } while (bVar2);
      }
      lVar9 = lVar9 + 1;
      local_12c = local_12c + 1;
      local_128 = local_128 + 1;
    } while (lVar9 < local_130);
  }
  local_124 = 1;
  lVar9 = 0;
  iVar3 = 2;
  do {
    iVar5 = iVar3;
    lVar4 = Network::BFS(&local_e0,local_130 * local_134,local_130 * local_134 + 1,&local_124);
    lVar9 = lVar9 + lVar4;
    iVar3 = iVar5 + 1;
    local_124 = iVar5;
  } while (lVar4 != 0);
  if (lVar9 == local_118) {
    pcVar7 = "Invalid";
    if (lVar9 != 0 && lVar9 == local_120) {
      pcVar7 = "Valid";
    }
    lVar9 = (ulong)(lVar9 == 0 || lVar9 != local_120) * 2 + 5;
  }
  else {
    lVar9 = 7;
    pcVar7 = "Invalid";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar9);
  std::
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ::~vector(&local_e0.g);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_e0.adjacency);
  if (local_e0.col.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.col.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&local_e0);
  std::
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ::~vector(&local_110);
  return 0;
}

Assistant:

int main(){
    int N, M;
    std::ios_base::sync_with_stdio(false);
    std::cin.tie(0);
    std::cin >> N >> M;
    std::vector<std::vector<long long> > table(N, std::vector<long long>(M));
    Network transport(N * M + 2);
    long long out = 0, in = 0;
    char elem;
    for (int i = 0; i < N; ++i) { //считываем элементы
        for (int j = 0; j < M; ++j) {
            std::cin >> elem;
            table[i][j] = valence(elem);
            if(elem == '.') {
                continue;
            }
            if((i + j) % 2 == 0) {
                transport.add_edge(N * M, M * i + j, table[i][j]);
                out += table[i][j];
            } else {
                transport.add_edge(M * i + j, N * M + 1, table[i][j]);
                in += table[i][j];
            }
        }
    }
    for (int i = 0; i < N; ++i) {
        for (int j = 0; j < M; ++j) {
            if(table[i][j] == -1 || (i + j) % 2 == 1) {
                continue;
            }
            int current_vertex = i * M + j; //текущая вершина; ниже - её соседи
            int right_neighbour = i * M + j + 1;
            int left_neighbour = i * M + j - 1;
            int up_neighbour = (i - 1) * M + j;
            int down_neighbour = (i + 1) * M + j;
            if ((j + 1) < M && table[i][j + 1] != -1) {
                transport.add_edge(current_vertex, right_neighbour, 1);
            }
            if ((j - 1) >= 0 && table[i][j - 1] != -1) {
                transport.add_edge(current_vertex, left_neighbour, 1);
            }
            if ((i - 1) >= 0 && table[i - 1][j] != -1) {
                transport.add_edge(current_vertex, up_neighbour, 1);
            }
            if ((i + 1) < N && table[i + 1][j] != -1) {
                transport.add_edge(current_vertex, down_neighbour, 1);
            }
        }
    }
    long long throughput = transport.EdmondsKarp(N * M, N * M + 1);
    if (throughput == in && throughput == out && throughput != 0){
        std::cout << "Valid";
    } else {
        std::cout << "Invalid";
    }
    return 0;
}